

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * skip_word(char *exp,char **str)

{
  char *__s2;
  int iVar1;
  size_t __n;
  ushort **ppuVar2;
  long *in_RSI;
  char *in_RDI;
  bool bVar3;
  int match;
  char *cur;
  size_t explen;
  char *local_8;
  
  __n = strlen(in_RDI);
  __s2 = (char *)*in_RSI;
  iVar1 = strncmp(in_RDI,__s2,__n);
  bVar3 = false;
  if ((((iVar1 == 0) && (bVar3 = true, __s2[__n] != '\0')) && (bVar3 = true, __s2[__n] != '/')) &&
     ((bVar3 = true, __s2[__n] != ']' && (bVar3 = true, __s2[__n] != '.')))) {
    ppuVar2 = __ctype_b_loc();
    bVar3 = ((*ppuVar2)[(int)__s2[__n]] & 0x2000) != 0;
  }
  if (bVar3) {
    *in_RSI = __n + *in_RSI;
    local_8 = (char *)*in_RSI;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char* skip_word(const char* exp, const char** str)
{
    size_t explen = strlen(exp);
    const char* cur = *str;
    int match = (!strncmp(exp, cur, explen) &&
                 (   !cur[explen]
                  || cur[explen] == '/' || cur[explen] == ']'
                  || cur[explen] == '.'
                  || isspace(cur[explen])));
    if(match) {
        *str += explen;
        return *str;
    }
    else return NULL;
}